

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# src_backend_nodes_makefuncs.cpp
# Opt level: O3

PGTypeName * duckdb_libpgquery::makeTypeName(char *typnam)

{
  PGValue *datum;
  PGList *pPVar1;
  PGTypeName *pPVar2;
  
  datum = makeString(typnam);
  pPVar1 = lcons(datum,(PGList *)0x0);
  pPVar2 = (PGTypeName *)newNode(0x38,T_PGTypeName);
  pPVar2->names = pPVar1;
  pPVar2->typmods = (PGList *)0x0;
  pPVar2->typemod = -1;
  pPVar2->location = -1;
  return pPVar2;
}

Assistant:

PGTypeName *makeTypeName(char *typnam) {
	return makeTypeNameFromNameList(list_make1(makeString(typnam)));
}